

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_set_align_text(ps_decoder_t *ps,char *text)

{
  logmath_t *lmath;
  int32 iVar1;
  s3wid_t sVar2;
  int iVar3;
  double dVar4;
  int wid_1;
  int wid;
  int nwords;
  int n;
  char delimfound;
  char *word;
  char *ptr;
  char *textbuf;
  fsg_model_t *fsg;
  char *text_local;
  ps_decoder_t *ps_local;
  
  fsg = (fsg_model_t *)text;
  text_local = (char *)ps;
  ptr = __ckd_salloc__(text,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                       ,0x2ac);
  word = string_trim(ptr,STRING_BOTH);
  wid_1 = 0;
  ptr = word;
  while( true ) {
    iVar1 = nextword(word," \t\n\r",(char **)&n,(char *)((long)&nwords + 3));
    if (iVar1 < 0) {
      lmath = *(logmath_t **)(text_local + 0x28);
      dVar4 = ps_config_float(*(ps_config_t **)text_local,"lw");
      textbuf = (char *)fsg_model_init("_align",lmath,(float32)(float)dVar4,wid_1 + 1);
      wid_1 = 0;
      word = ptr;
      while( true ) {
        iVar1 = nextword(word," \t\n\r",(char **)&n,(char *)((long)&nwords + 3));
        if (iVar1 < 0) {
          ckd_free(ptr);
          textbuf[0x3c] = '\0';
          textbuf[0x3d] = '\0';
          textbuf[0x3e] = '\0';
          textbuf[0x3f] = '\0';
          *(int *)(textbuf + 0x40) = wid_1;
          iVar3 = ps_add_fsg((ps_decoder_t *)text_local,"_align",(fsg_model_t *)textbuf);
          if (iVar3 < 0) {
            fsg_model_free((fsg_model_t *)textbuf);
            ps_local._4_4_ = -1;
          }
          else {
            fsg_model_free((fsg_model_t *)textbuf);
            ps_local._4_4_ = ps_activate_search((ps_decoder_t *)text_local,"_align");
          }
          return ps_local._4_4_;
        }
        sVar2 = dict_wordid(*(dict_t **)(text_local + 0x18),_n);
        if (sVar2 == -1) break;
        iVar3 = fsg_model_word_add((fsg_model_t *)textbuf,_n);
        fsg_model_trans_add((fsg_model_t *)textbuf,wid_1,wid_1 + 1,0,iVar3);
        word = _n + iVar1;
        *word = nwords._3_1_;
        wid_1 = wid_1 + 1;
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x2c8,"Unknown word %s\n",_n);
      ckd_free(ptr);
      return -1;
    }
    sVar2 = dict_wordid(*(dict_t **)(text_local + 0x18),_n);
    if (sVar2 == -1) break;
    word = _n + iVar1;
    *word = nwords._3_1_;
    wid_1 = wid_1 + 1;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
          ,0x2b7,"Unknown word %s\n",_n);
  ckd_free(ptr);
  return -1;
}

Assistant:

int
ps_set_align_text(ps_decoder_t *ps, const char *text)
{
    fsg_model_t *fsg;
    char *textbuf = ckd_salloc(text);
    char *ptr, *word, delimfound;
    int n, nwords;

    textbuf = string_trim(textbuf, STRING_BOTH);
    /* First pass: count and verify words */
    nwords = 0;
    ptr = textbuf;
    while ((n = nextword(ptr, " \t\n\r", &word, &delimfound)) >= 0) {
        int wid;
        if ((wid = dict_wordid(ps->dict, word)) == BAD_S3WID) {
            E_ERROR("Unknown word %s\n", word);
            ckd_free(textbuf);
            return -1;
        }
        ptr = word + n;
        *ptr = delimfound;
        ++nwords;
    }
    /* Second pass: make fsg */
    fsg = fsg_model_init("_align", ps->lmath,
                         ps_config_float(ps->config, "lw"),
                         nwords + 1);
    nwords = 0;
    ptr = textbuf;
    while ((n = nextword(ptr, " \t\n\r", &word, &delimfound)) >= 0) {
        int wid;
        if ((wid = dict_wordid(ps->dict, word)) == BAD_S3WID) {
            E_ERROR("Unknown word %s\n", word);
            ckd_free(textbuf);
            return -1;
        }
        wid = fsg_model_word_add(fsg, word);
        fsg_model_trans_add(fsg, nwords, nwords + 1, 0, wid);
        ptr = word + n;
        *ptr = delimfound;
        ++nwords;
    }
    ckd_free(textbuf);
    fsg->start_state = 0;
    fsg->final_state = nwords;
    if (ps_add_fsg(ps, PS_DEFAULT_ALIGN_SEARCH, fsg) < 0) {
        fsg_model_free(fsg);
        return -1;
    }
    fsg_model_free(fsg);
    return ps_activate_search(ps, PS_DEFAULT_ALIGN_SEARCH);
}